

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestCaseTracking::NameAndLocation::NameAndLocation
          (NameAndLocation *this,string *_name,SourceLineInfo *_location)

{
  SourceLineInfo *_location_local;
  string *_name_local;
  NameAndLocation *this_local;
  
  std::__cxx11::string::string((string *)this,_name);
  (this->location).file = _location->file;
  (this->location).line = _location->line;
  return;
}

Assistant:

NameAndLocation::NameAndLocation( std::string const& _name, SourceLineInfo const& _location )
    :   name( _name ),
        location( _location )
    {}